

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

json * __thiscall argo::json::insert(json *this,string *name,json *j)

{
  json *pjVar1;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> local_28;
  json *local_20;
  json *j_local;
  string *name_local;
  json *this_local;
  
  local_20 = j;
  j_local = (json *)name;
  name_local = (string *)this;
  pjVar1 = (json *)operator_new(0x58);
  json(pjVar1,local_20);
  std::unique_ptr<argo::json,std::default_delete<argo::json>>::
  unique_ptr<std::default_delete<argo::json>,void>
            ((unique_ptr<argo::json,std::default_delete<argo::json>> *)&local_28,pjVar1);
  pjVar1 = insert(this,name,&local_28);
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr(&local_28);
  return pjVar1;
}

Assistant:

const json &json::insert(const string &name, const json &j)
{
    return insert(name, unique_ptr<json>(new json(j)));
}